

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O1

void FIX::socket_close(socket_handle s)

{
  shutdown(s,2);
  close(s);
  return;
}

Assistant:

void socket_close(socket_handle s )
{
  shutdown( s, 2 );
#ifdef _MSC_VER
  closesocket( s );
#else
  close( s );
#endif
}